

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void opj_dwt_encode_1_real(OPJ_INT32 *a,OPJ_INT32 dn,OPJ_INT32 sn,OPJ_INT32 cas)

{
  OPJ_INT32 OVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (cas == 0) {
    if (0 < dn || 1 < sn) {
      lVar2 = (long)(sn * 2 + -2);
      lVar13 = 0;
      uVar3 = 0;
      if (0 < dn) {
        uVar3 = (ulong)(uint)dn;
      }
      uVar14 = 0;
      while (uVar3 != uVar14) {
        lVar12 = lVar2;
        if ((long)uVar14 < (long)sn) {
          lVar12 = lVar13;
        }
        lVar13 = lVar13 + 2;
        lVar11 = lVar2;
        if ((int)(uVar14 + 1) < sn) {
          lVar11 = lVar13;
        }
        OVar1 = opj_int_fix_mul(a[lVar11] + a[lVar12],0x32c1);
        a[uVar14 * 2 + 1] = a[uVar14 * 2 + 1] - OVar1;
        uVar14 = uVar14 + 1;
      }
      lVar13 = (long)(dn * 2 + -1);
      lVar12 = (long)dn;
      uVar9 = 0;
      uVar14 = 0;
      if (0 < sn) {
        uVar14 = (ulong)(uint)sn;
      }
      lVar11 = 1;
      uVar15 = 0xffffffff;
      for (; uVar14 != uVar9; uVar9 = uVar9 + 1) {
        piVar6 = a + 1;
        if ((uVar9 != 0) && (piVar6 = a + lVar13, (long)uVar9 <= lVar12)) {
          piVar6 = a + (uVar15 & 0xffffffff);
        }
        lVar5 = lVar13;
        if ((long)uVar9 < lVar12) {
          lVar5 = lVar11;
        }
        OVar1 = opj_int_fix_mul(a[lVar5] + *piVar6,0x1b2);
        a[uVar9 * 2] = a[uVar9 * 2] - OVar1;
        uVar15 = uVar15 + 2;
        lVar11 = lVar11 + 2;
      }
      lVar11 = 0;
      uVar9 = 0;
      while (uVar3 != uVar9) {
        lVar5 = lVar2;
        if ((long)uVar9 < (long)sn) {
          lVar5 = lVar11;
        }
        lVar11 = lVar11 + 2;
        lVar8 = lVar2;
        if ((int)(uVar9 + 1) < sn) {
          lVar8 = lVar11;
        }
        OVar1 = opj_int_fix_mul(a[lVar8] + a[lVar5],0x1c41);
        a[uVar9 * 2 + 1] = a[uVar9 * 2 + 1] + OVar1;
        uVar9 = uVar9 + 1;
      }
      lVar2 = 1;
      uVar15 = 0xffffffff;
      for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
        piVar6 = a + 1;
        if ((uVar9 != 0) && (piVar6 = a + lVar13, (long)uVar9 <= lVar12)) {
          piVar6 = a + (uVar15 & 0xffffffff);
        }
        lVar11 = lVar13;
        if ((long)uVar9 < lVar12) {
          lVar11 = lVar2;
        }
        OVar1 = opj_int_fix_mul(a[lVar11] + *piVar6,0xe31);
        a[uVar9 * 2] = a[uVar9 * 2] + OVar1;
        uVar15 = uVar15 + 2;
        lVar2 = lVar2 + 2;
      }
      for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
        OVar1 = opj_int_fix_mul(a[uVar9 * 2 + 1],0x13ae);
        a[uVar9 * 2 + 1] = OVar1;
      }
      for (uVar3 = 0; uVar14 != uVar3; uVar3 = uVar3 + 1) {
        OVar1 = opj_int_fix_mul(a[uVar3 * 2],0x1a03);
        a[uVar3 * 2] = OVar1;
      }
    }
  }
  else if (1 < dn || 0 < sn) {
    lVar2 = (long)(sn * 2 + -1);
    lVar13 = (long)sn;
    uVar14 = 0;
    uVar3 = 0;
    if (0 < dn) {
      uVar3 = (ulong)(uint)dn;
    }
    lVar12 = 1;
    uVar9 = 0xffffffff;
    for (; uVar3 != uVar14; uVar14 = uVar14 + 1) {
      lVar11 = lVar2;
      if ((long)uVar14 < lVar13) {
        lVar11 = lVar12;
      }
      piVar6 = a + 1;
      if ((uVar14 != 0) && (piVar6 = a + lVar2, (long)uVar14 <= lVar13)) {
        piVar6 = a + (uVar9 & 0xffffffff);
      }
      OVar1 = opj_int_fix_mul(a[lVar11] + *piVar6,0x32c1);
      a[uVar14 * 2] = a[uVar14 * 2] - OVar1;
      uVar9 = uVar9 + 2;
      lVar12 = lVar12 + 2;
    }
    uVar15 = (ulong)(dn * 2 + -2);
    uVar9 = 0;
    uVar14 = (ulong)(uint)sn;
    if (sn < 1) {
      uVar14 = uVar9;
    }
    uVar10 = 0;
    while (uVar14 != uVar10) {
      uVar4 = uVar15;
      if ((long)uVar10 < (long)dn) {
        uVar4 = uVar9;
      }
      uVar9 = uVar9 + 2;
      uVar7 = uVar15;
      if ((int)(uVar10 + 1) < dn) {
        uVar7 = uVar9;
      }
      OVar1 = opj_int_fix_mul(a[uVar7] + a[uVar4],0x1b2);
      a[uVar10 * 2 + 1] = a[uVar10 * 2 + 1] - OVar1;
      uVar10 = uVar10 + 1;
    }
    lVar12 = 1;
    uVar10 = 0xffffffff;
    for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
      lVar11 = lVar2;
      if ((long)uVar9 < lVar13) {
        lVar11 = lVar12;
      }
      piVar6 = a + 1;
      if ((uVar9 != 0) && (piVar6 = a + lVar2, (long)uVar9 <= lVar13)) {
        piVar6 = a + (uVar10 & 0xffffffff);
      }
      OVar1 = opj_int_fix_mul(a[lVar11] + *piVar6,0x1c41);
      a[uVar9 * 2] = a[uVar9 * 2] + OVar1;
      uVar10 = uVar10 + 2;
      lVar12 = lVar12 + 2;
    }
    uVar10 = 0;
    uVar9 = 0;
    while (uVar14 != uVar9) {
      uVar4 = uVar15;
      if ((long)uVar9 < (long)dn) {
        uVar4 = uVar10;
      }
      uVar10 = uVar10 + 2;
      uVar7 = uVar15;
      if ((int)(uVar9 + 1) < dn) {
        uVar7 = uVar10;
      }
      OVar1 = opj_int_fix_mul(a[uVar7] + a[uVar4],0xe31);
      a[uVar9 * 2 + 1] = a[uVar9 * 2 + 1] + OVar1;
      uVar9 = uVar9 + 1;
    }
    for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
      OVar1 = opj_int_fix_mul(a[uVar9 * 2],0x13ae);
      a[uVar9 * 2] = OVar1;
    }
    for (uVar3 = 0; uVar14 != uVar3; uVar3 = uVar3 + 1) {
      OVar1 = opj_int_fix_mul(a[uVar3 * 2 + 1],0x1a03);
      a[uVar3 * 2 + 1] = OVar1;
    }
  }
  return;
}

Assistant:

static void opj_dwt_encode_1_real(OPJ_INT32 *a, OPJ_INT32 dn, OPJ_INT32 sn,
                                  OPJ_INT32 cas)
{
    OPJ_INT32 i;
    if (!cas) {
        if ((dn > 0) || (sn > 1)) { /* NEW :  CASE ONE ELEMENT */
            for (i = 0; i < dn; i++) {
                OPJ_D(i) -= opj_int_fix_mul(OPJ_S_(i) + OPJ_S_(i + 1), 12993);
            }
            for (i = 0; i < sn; i++) {
                OPJ_S(i) -= opj_int_fix_mul(OPJ_D_(i - 1) + OPJ_D_(i), 434);
            }
            for (i = 0; i < dn; i++) {
                OPJ_D(i) += opj_int_fix_mul(OPJ_S_(i) + OPJ_S_(i + 1), 7233);
            }
            for (i = 0; i < sn; i++) {
                OPJ_S(i) += opj_int_fix_mul(OPJ_D_(i - 1) + OPJ_D_(i), 3633);
            }
            for (i = 0; i < dn; i++) {
                OPJ_D(i) = opj_int_fix_mul(OPJ_D(i), 5038);    /*5038 */
            }
            for (i = 0; i < sn; i++) {
                OPJ_S(i) = opj_int_fix_mul(OPJ_S(i), 6659);    /*6660 */
            }
        }
    } else {
        if ((sn > 0) || (dn > 1)) { /* NEW :  CASE ONE ELEMENT */
            for (i = 0; i < dn; i++) {
                OPJ_S(i) -= opj_int_fix_mul(OPJ_DD_(i) + OPJ_DD_(i - 1), 12993);
            }
            for (i = 0; i < sn; i++) {
                OPJ_D(i) -= opj_int_fix_mul(OPJ_SS_(i) + OPJ_SS_(i + 1), 434);
            }
            for (i = 0; i < dn; i++) {
                OPJ_S(i) += opj_int_fix_mul(OPJ_DD_(i) + OPJ_DD_(i - 1), 7233);
            }
            for (i = 0; i < sn; i++) {
                OPJ_D(i) += opj_int_fix_mul(OPJ_SS_(i) + OPJ_SS_(i + 1), 3633);
            }
            for (i = 0; i < dn; i++) {
                OPJ_S(i) = opj_int_fix_mul(OPJ_S(i), 5038);    /*5038 */
            }
            for (i = 0; i < sn; i++) {
                OPJ_D(i) = opj_int_fix_mul(OPJ_D(i), 6659);    /*6660 */
            }
        }
    }
}